

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O0

Error asmjit::X86Logging_formatImmBits(StringBuilder *sb,uint32_t u8,ImmBits *bits,uint32_t count)

{
  undefined8 uVar1;
  uint op;
  Error EVar2;
  StringBuilder *this;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  Error _err_1;
  Error _err;
  char *str;
  uint32_t value;
  ImmBits *spec;
  uint32_t i;
  char buf [64];
  uint32_t n;
  uint32_t i_1;
  Error local_f4;
  undefined8 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1b;
  uint in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  byte *str_00;
  uint local_bc;
  byte local_b8 [64];
  int local_78;
  uint local_74;
  long local_70;
  uint local_64;
  undefined8 local_60;
  undefined8 local_50;
  byte *local_48;
  undefined8 local_40;
  undefined1 local_31;
  undefined8 local_30;
  undefined1 local_21;
  undefined8 local_20;
  uint local_18;
  uint local_14;
  byte *local_10;
  
  local_78 = 0;
  local_bc = 0;
  local_74 = in_ECX;
  local_70 = in_RDX;
  local_64 = in_ESI;
  local_60 = in_RDI;
  do {
    if (local_74 <= local_bc) {
      if (local_78 == 0) {
        local_f4 = 0;
      }
      else {
        local_30 = local_60;
        local_31 = 0x3e;
        local_f4 = StringBuilder::_opChar
                             ((StringBuilder *)
                              CONCAT44(in_stack_ffffffffffffff1c,
                                       CONCAT13(in_stack_ffffffffffffff1b,
                                                CONCAT12(in_stack_ffffffffffffff1a,
                                                         in_stack_ffffffffffffff18))),
                              (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                              (char)((ulong)in_stack_ffffffffffffff10 >> 0x18));
      }
      return local_f4;
    }
    this = (StringBuilder *)(local_70 + (ulong)local_bc * 0x30);
    op = (local_64 & *(byte *)&this->_data) >> (*(byte *)((long)&this->_data + 1) & 0x1f);
    in_stack_ffffffffffffff1c = (uint)*(byte *)((long)&this->_data + 2);
    if (in_stack_ffffffffffffff1c == 0) {
      local_10 = (byte *)((long)&this->_data + 3);
      for (local_18 = 0; str_00 = local_10, local_14 = op, local_18 < op; local_18 = local_18 + 1) {
        for (; *local_10 != 0; local_10 = local_10 + 1) {
        }
        local_10 = local_10 + 1;
      }
    }
    else {
      if (in_stack_ffffffffffffff1c != 1) {
        return 4;
      }
      snprintf((char *)local_b8,0x40,(char *)((long)&this->_data + 3),(ulong)op);
      str_00 = local_b8;
    }
    uVar1 = local_60;
    if (*str_00 != 0) {
      local_78 = local_78 + 1;
      in_stack_ffffffffffffff1a = 0x7c;
      in_stack_ffffffffffffff1b = 0x3c;
      if (local_78 != 1) {
        in_stack_ffffffffffffff1b = 0x7c;
      }
      local_20 = local_60;
      local_21 = in_stack_ffffffffffffff1b;
      EVar2 = StringBuilder::_opChar
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff1c,
                                  CONCAT13(in_stack_ffffffffffffff1b,
                                           CONCAT12(0x7c,in_stack_ffffffffffffff18))),
                         (uint32_t)((ulong)local_60 >> 0x20),(char)((ulong)local_60 >> 0x18));
      if (EVar2 != 0) {
        return EVar2;
      }
      local_40 = local_60;
      local_50 = 0xffffffffffffffff;
      local_48 = str_00;
      EVar2 = StringBuilder::_opString(this,op,(char *)str_00,(ulong)in_stack_ffffffffffffff20);
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_ffffffffffffff20 = 0;
      in_stack_ffffffffffffff10 = uVar1;
    }
    local_bc = local_bc + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmBits(StringBuilder& sb, uint32_t u8, const ImmBits* bits, uint32_t count) noexcept {
  uint32_t n = 0;
  char buf[64];

  for (uint32_t i = 0; i < count; i++) {
    const ImmBits& spec = bits[i];

    uint32_t value = (u8 & static_cast<uint32_t>(spec.mask)) >> spec.shift;
    const char* str = nullptr;

    switch (spec.mode) {
      case ImmBits::kModeLookup:
        str = Utils::findPackedString(spec.text, value);
        break;

      case ImmBits::kModeFormat:
        snprintf(buf, sizeof(buf), spec.text, static_cast<unsigned int>(value));
        str = buf;
        break;

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (!str[0])
      continue;

    ASMJIT_PROPAGATE(sb.appendChar(++n == 1 ? '<' : '|'));
    ASMJIT_PROPAGATE(sb.appendString(str));
  }

  return n ? sb.appendChar('>') : static_cast<Error>(kErrorOk);
}